

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memtable.cc
# Opt level: O3

Slice __thiscall leveldb::MemTableIterator::key(MemTableIterator *this)

{
  Node *pNVar1;
  char *p;
  char *pcVar2;
  long in_FS_OFFSET;
  Slice SVar3;
  uint32_t local_14;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  pNVar1 = (this->iter_).node_;
  if (pNVar1 == (Node *)0x0) {
    __assert_fail("Valid()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/db/skiplist.h"
                  ,0xca,
                  "const Key &leveldb::SkipList<const char *, leveldb::MemTable::KeyComparator>::Iterator::key() const [Key = const char *, Comparator = leveldb::MemTable::KeyComparator]"
                 );
  }
  p = pNVar1->key;
  if (*p < 0) {
    pcVar2 = GetVarint32PtrFallback(p,p + 5,&local_14);
  }
  else {
    pcVar2 = p + 1;
    local_14 = (int)*p;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    SVar3.size_._0_4_ = local_14;
    SVar3.data_ = pcVar2;
    SVar3.size_._4_4_ = 0;
    return SVar3;
  }
  __stack_chk_fail();
}

Assistant:

Slice key() const override { return GetLengthPrefixedSlice(iter_.key()); }